

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimics_pcre.cc
# Opt level: O3

bool __thiscall
re2::PCREWalker::PostVisit
          (PCREWalker *this,Regexp *re,bool parent_arg,bool pre_arg,bool *child_args,int nchild_args
          )

{
  bool bVar1;
  ulong uVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  
  if (0 < nchild_args) {
    uVar2 = 0;
    do {
      if (child_args[uVar2] == false) {
        return false;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)nchild_args != uVar2);
  }
  switch(re->op_) {
  case '\x02':
  case '\x13':
    if (-1 < (short)re->parse_flags_) {
      return true;
    }
    break;
  case '\x03':
    if ((re->field_7).field_0.max_ != 0xb) {
      return true;
    }
    break;
  default:
    goto LAB_001290a7;
  case '\n':
    if ((re->field_7).field_0.max_ != -1) {
      return true;
    }
  case '\a':
  case '\b':
  case '\t':
    if (re->nsub_ < 2) {
      paVar3 = &re->field_5;
    }
    else {
      paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    bVar1 = CanBeEmptyString(paVar3->subone_);
    if (!bVar1) {
LAB_001290a7:
      return true;
    }
    break;
  case '\x0e':
    break;
  }
  return false;
}

Assistant:

bool PCREWalker::PostVisit(Regexp* re, bool parent_arg, bool pre_arg,
                           bool* child_args, int nchild_args) {
  // If children failed, so do we.
  for (int i = 0; i < nchild_args; i++)
    if (!child_args[i])
      return false;

  // Otherwise look for other reasons to fail.
  switch (re->op()) {
    // Look for repeated empty string.
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      if (CanBeEmptyString(re->sub()[0]))
        return false;
      break;
    case kRegexpRepeat:
      if (re->max() == -1 && CanBeEmptyString(re->sub()[0]))
        return false;
      break;

    // Look for \v
    case kRegexpLiteral:
      if (re->rune() == '\v')
        return false;
      break;

    // Look for $ in single-line mode.
    case kRegexpEndText:
    case kRegexpEmptyMatch:
      if (re->parse_flags() & Regexp::WasDollar)
        return false;
      break;

    // Look for ^ in multi-line mode.
    case kRegexpBeginLine:
      // No condition: in single-line mode ^ becomes kRegexpBeginText.
      return false;

    default:
      break;
  }

  // Not proven guilty.
  return true;
}